

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::logic_t_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::logic_t_const&> *this,logic_t *rhs)

{
  lest *this_00;
  logic_t *in_R8;
  allocator<char> local_69;
  logic_t local_68 [8];
  string local_48;
  int local_28;
  logic_t local_24;
  string *local_20;
  logic_t *rhs_local;
  expression_lhs<const_(anonymous_namespace)::logic_t_&> *this_local;
  
  local_28 = rhs->value;
  local_20 = (string *)rhs;
  rhs_local = (logic_t *)this;
  this_local = (expression_lhs<const_(anonymous_namespace)::logic_t_&> *)__return_storage_ptr__;
  local_24 = anon_unknown.dwarf_e9ed::logic_t::operator==(*(logic_t **)this,local_28);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"==",&local_69);
  to_string<(anonymous_namespace)::logic_t,(anonymous_namespace)::logic_t>
            (&local_48,this_00,local_68,local_20,in_R8);
  result::result<(anonymous_namespace)::logic_t>(__return_storage_ptr__,&local_24,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }